

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::generate_program(t_html_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  long lVar4;
  t_program *ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  pointer pptVar6;
  pointer pptVar7;
  allocator local_a9;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  string fname;
  _Vector_base<t_const_*,_std::allocator<t_const_*>_> local_48;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&fname,this);
  iVar1 = mkdir(fname._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&fname);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(&services,this);
      std::__cxx11::string::string
                ((string *)&consts,
                 (char *)services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_a9);
      std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &consts,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&fname,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::operator+(&fname,&((this->super_t_generator).program_)->name_,".html");
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)&fname);
  std::__cxx11::string::~string((string *)&fname);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&consts,this);
  std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&consts
                 ,&this->current_file_);
  std::__cxx11::string::~string((string *)&consts);
  std::__cxx11::string::string((string *)&consts,fname._M_dataplus._M_p,(allocator *)&services);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&consts,__oflag);
  std::__cxx11::string::~string((string *)&consts);
  poVar3 = std::operator<<((ostream *)this_00,"<!DOCTYPE html>");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)this_00,"<html lang=\"en\">");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)this_00,"<head>");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)this_00,
                           "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  generate_style_tag(this);
  poVar3 = std::operator<<((ostream *)this_00,"<title>Thrift module: ");
  poVar3 = std::operator<<(poVar3,(string *)&((this->super_t_generator).program_)->name_);
  poVar3 = std::operator<<(poVar3,"</title></head><body>");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"<div class=\"container-fluid\">");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"<h1>Thrift module: ");
  poVar3 = std::operator<<(poVar3,(string *)&((this->super_t_generator).program_)->name_);
  poVar3 = std::operator<<(poVar3,"</h1>");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  generate_program_toc(this);
  ptVar5 = (this->super_t_generator).program_;
  if ((ptVar5->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"<hr/><h2 id=\"Constants\">Constants</h2>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              (&consts,&((this->super_t_generator).program_)->consts_);
    std::operator<<((ostream *)this_00,
                    "<table class=\"table-bordered table-striped table-condensed\">");
    poVar3 = std::operator<<((ostream *)this_00,
                             "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>"
                            );
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_48,&consts);
    (*(this->super_t_generator)._vptr_t_generator[0x11])(this,&local_48);
    std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base(&local_48);
    std::operator<<((ostream *)this_00,"</tbody></table>");
    std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base
              (&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"<hr/><h2 id=\"Enumerations\">Enumerations</h2>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&consts,
               &((this->super_t_generator).program_)->enums_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar7);
    }
    std::_Vector_base<t_enum_*,_std::allocator<t_enum_*>_>::~_Vector_base
              ((_Vector_base<t_enum_*,_std::allocator<t_enum_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"<hr/><h2 id=\"Typedefs\">Type declarations</h2>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&consts,
               &((this->super_t_generator).program_)->typedefs_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar7);
    }
    std::_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>::~_Vector_base
              ((_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"<hr/><h2 id=\"Structs\">Data structures</h2>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&consts,
               &((this->super_t_generator).program_)->objects_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      iVar1 = (*((*pptVar7)->super_t_doc)._vptr_t_doc[0xc])();
      lVar4 = 0xa8;
      if ((char)iVar1 != '\0') {
        lVar4 = 0xc0;
      }
      (**(code **)((long)(this->super_t_generator)._vptr_t_generator + lVar4))(this,*pptVar7);
    }
    std::_Vector_base<t_struct_*,_std::allocator<t_struct_*>_>::~_Vector_base
              ((_Vector_base<t_struct_*,_std::allocator<t_struct_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"<hr/><h2 id=\"Services\">Services</h2>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              (&services,&((this->super_t_generator).program_)->services_);
    for (pptVar6 = services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar6 !=
        services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x1a])((string *)&consts,this,*pptVar6);
      std::__cxx11::string::operator=
                ((string *)&(this->super_t_generator).service_name_,(string *)&consts);
      std::__cxx11::string::~string((string *)&consts);
      (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar6);
    }
    std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base
              (&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>);
  }
  poVar3 = std::operator<<((ostream *)this_00,"</div></body></html>");
  iVar1 = 0x36c0b8;
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,iVar1);
  generate_index(this);
  generate_css(this);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void t_html_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  current_file_ = program_->get_name() + ".html";
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl;
  f_out_ << "<html lang=\"en\">" << endl;
  f_out_ << "<head>" << endl;
  f_out_ << "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />" << endl;
  generate_style_tag();
  f_out_ << "<title>Thrift module: " << program_->get_name() << "</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl
         << "<h1>Thrift module: " << program_->get_name() << "</h1>" << endl;

  print_doc(program_);

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "<hr/><h2 id=\"Constants\">Constants</h2>" << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
    f_out_ << "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>" << endl;
    generate_consts(consts);
    f_out_ << "</tbody></table>";
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "<hr/><h2 id=\"Enumerations\">Enumerations</h2>" << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "<hr/><h2 id=\"Typedefs\">Type declarations</h2>" << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "<hr/><h2 id=\"Structs\">Data structures</h2>" << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "<hr/><h2 id=\"Services\">Services</h2>" << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << "</div></body></html>" << endl;
  f_out_.close();

  generate_index();
  generate_css();
}